

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Options::Parse(Options *this,int argc,char **argv)

{
  int iVar1;
  iterator iVar2;
  char *__s;
  int ch;
  allocator<char> local_95;
  int local_94;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_90;
  map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  *local_88;
  char **local_80;
  option local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.flag = (int *)0x0;
  local_78.val = 0;
  local_78._28_4_ = 0;
  local_78.name = (char *)0x0;
  local_78.has_arg = 0;
  local_78._12_4_ = 0;
  local_94 = argc;
  local_80 = argv;
  std::vector<option,_std::allocator<option>_>::emplace_back<option>(&this->options,&local_78);
  local_88 = &this->setters;
  local_90 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->was_set;
  while( true ) {
    iVar1 = getopt_long(local_94,local_80,(this->optstr)._M_dataplus._M_p,
                        (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                        super__Vector_impl_data._M_start,0);
    local_78.name = (char *)CONCAT44(local_78.name._4_4_,iVar1);
    if (iVar1 == -1) break;
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::find(&local_88->_M_t,(key_type *)&local_78);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->setters)._M_t._M_impl.super__Rb_tree_header)
    break;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>(local_90,(int *)&local_78);
    __s = _optarg;
    if (_optarg == (char *)0x0) {
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_95);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&iVar2._M_node[1]._M_parent,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return iVar1 == -1;
}

Assistant:

inline bool Options::Parse(int argc, char** argv) {
    this->options.push_back({0, 0, 0, 0});
    int ch;
    while ((ch = getopt_long(argc, argv, this->optstr.c_str(), &this->options[0], NULL)) != -1) {
        auto it = this->setters.find(ch);
        if (it != this->setters.end()) {
            this->was_set.insert(ch);
            it->second(optarg ? optarg : "");
        } else {
            return false;
        }
    }
    return true;
}